

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O2

void jsonrpccxx::check_param_type<Product>(size_t index,json *x,value_t expectedType,type *param_4)

{
  JsonRpcException *this;
  value_t t;
  value_t t_00;
  size_t index_local;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (x->m_type == expectedType) {
    return;
  }
  index_local = index;
  this = (JsonRpcException *)__cxa_allocate_exception(0x60);
  type_name_abi_cxx11_(&local_98,(jsonrpccxx *)(ulong)expectedType,t);
  std::operator+(&local_78,"invalid parameter: must be ",&local_98);
  std::operator+(&local_58,&local_78,", but is ");
  type_name_abi_cxx11_(&local_b8,(jsonrpccxx *)(ulong)x->m_type,t_00);
  std::operator+(&local_38,&local_58,&local_b8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json<unsigned_long_&,_unsigned_long,_0>(&local_c8,&index_local);
  JsonRpcException::JsonRpcException(this,-0x7f5a,&local_38,&local_c8);
  __cxa_throw(this,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
}

Assistant:

inline void check_param_type(size_t index, const json &x, json::value_t expectedType, typename std::enable_if<!std::is_arithmetic<T>::value>::type * = 0) {
    if (x.type() != expectedType) {
      throw JsonRpcException(invalid_params, "invalid parameter: must be " + type_name(expectedType) + ", but is " + type_name(x.type()), index);
    }
  }